

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)18>_> obj;
  Environment env;
  Resources res;
  VkPipeline local_188;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_180;
  Move<vk::Handle<(vk::HandleType)18>_> local_168;
  Environment local_140;
  Resources local_108;
  
  local_140.vkp = *(PlatformInterface **)(this + 8);
  local_140.vkd = Context::getDeviceInterface((Context *)this);
  local_140.device = Context::getDevice((Context *)this);
  local_140.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_140.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_140.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_140.maxResourceConsumers = 1;
  GraphicsPipeline::Resources::Resources(&local_108,&local_140,extraout_RDX);
  GraphicsPipeline::create(&local_168,&local_140,&local_108,param_4);
  DStack_180.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_180.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_188.m_internal._4_4_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal._4_4_;
  local_188.m_internal._0_4_ =
       (undefined4)local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  DStack_180.m_deviceIface._0_4_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_180.m_deviceIface._4_4_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface._4_4_;
  if (local_188.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_180,local_188);
  }
  local_188.m_internal = (deUint64)&DStack_180.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_188.m_internal,
             (undefined1 *)
             (CONCAT44(DStack_180.m_deviceIface._4_4_,DStack_180.m_deviceIface._0_4_) +
             local_188.m_internal));
  if ((VkDevice *)local_188.m_internal != &DStack_180.m_device) {
    operator_delete((void *)local_188.m_internal,(ulong)(DStack_180.m_device + 1));
  }
  GraphicsPipeline::Resources::~Resources(&local_108);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}